

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall MCU::zigzag(MCU *this)

{
  byte bVar1;
  byte bVar2;
  BLOCK (*paaaadVar3) [2] [2];
  BLOCK (*paaaadVar4) [2] [2];
  BLOCK (*paaaadVar5) [2] [2];
  int (*paiVar6) [8];
  int i_1;
  int h;
  ulong uVar7;
  int i;
  long lVar8;
  BLOCK (*paaaadVar9) [2] [2];
  int j;
  long lVar10;
  long lVar11;
  int w;
  ulong uVar12;
  int zz [8] [8];
  
  paaaadVar3 = this->mcu;
  for (lVar11 = 1; paaaadVar3 = paaaadVar3 + 1, lVar11 != 4; lVar11 = lVar11 + 1) {
    bVar1 = subVector[lVar11].height;
    paaaadVar5 = paaaadVar3;
    for (uVar7 = 0; uVar7 != bVar1; uVar7 = uVar7 + 1) {
      bVar2 = subVector[lVar11].width;
      paaaadVar9 = paaaadVar5;
      for (uVar12 = 0; uVar12 != bVar2; uVar12 = uVar12 + 1) {
        memcpy(zz,&DAT_00106120,0x100);
        paiVar6 = zz;
        for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
          for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
            (*paiVar6)[lVar10] =
                 (int)this->mcu[lVar11][uVar7][uVar12][(*paiVar6)[lVar10] / 8]
                      [(*paiVar6)[lVar10] % 8];
          }
          paiVar6 = paiVar6 + 1;
        }
        paaaadVar4 = paaaadVar9;
        paiVar6 = zz;
        for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
          for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
            (*paaaadVar4)[0][0][0][lVar10] = (double)(*paiVar6)[lVar10];
          }
          paiVar6 = paiVar6 + 1;
          paaaadVar4 = (BLOCK (*) [2] [2])((*paaaadVar4)[0][0] + 1);
        }
        paaaadVar9 = (BLOCK (*) [2] [2])((*paaaadVar9)[0] + 1);
      }
      paaaadVar5 = (BLOCK (*) [2] [2])(*paaaadVar5 + 1);
    }
  }
  return;
}

Assistant:

void zigzag() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    int zz[8][8] = {
                            { 0,  1,  5,  6, 14, 15, 27, 28},
                            { 2,  4,  7, 13, 16, 26, 29, 42},
                            { 3,  8, 12, 17, 25, 30, 41, 43},
                            { 9, 11, 18, 24, 31, 40, 44, 53},
                            {10, 19, 23, 32, 39, 45, 52, 54},
                            {20, 22, 33, 38, 46, 51, 55, 60},
                            {21, 34, 37, 47, 50, 56, 59, 61},
                            {35, 36, 48, 49, 57, 58, 62, 63}
                    };
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            zz[i][j] = mcu[id][h][w][zz[i][j] / 8][zz[i][j] % 8];
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] = zz[i][j];
                        }
                    }
                }
            }
        }
    }